

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls.cpp
# Opt level: O1

unique_ptr<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_> __thiscall
charls::jls_codec_factory<charls::encoder_strategy>::create_codec
          (jls_codec_factory<charls::encoder_strategy> *this,frame_info *frame,
          coding_parameters *parameters,jpegls_pc_parameters *preset_coding_parameters)

{
  interleave_mode iVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  default_traits<unsigned_char,_unsigned_char> traits;
  default_traits<unsigned_short,_unsigned_short> traits_00;
  undefined8 uVar5;
  int32_t iVar6;
  int32_t iVar7;
  int iVar8;
  jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy> *this_00
  ;
  jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
  *this_01;
  pointer *__ptr;
  int iVar9;
  undefined4 *in_R8;
  pointer __old_p;
  pointer __p;
  uint uVar10;
  undefined8 local_68;
  int iStack_60;
  int32_t iStack_5c;
  int32_t local_58;
  int local_54;
  undefined4 local_50;
  ulong local_48;
  jpegls_pc_parameters *local_40;
  coding_parameters *local_38;
  
  *(undefined8 *)this = 0;
  if (in_R8[4] == 0x40) {
    try_create_optimized_codec
              ((jls_codec_factory<charls::encoder_strategy> *)&local_68,frame,parameters);
    uVar5 = local_68;
    local_68 = 0;
    *(undefined8 *)this = uVar5;
  }
  if (*(long *)this == 0) {
    iVar1 = parameters->interleave_mode;
    local_40 = preset_coding_parameters;
    local_38 = parameters;
    if ((int)iVar1 < 9) {
      if (0xf < iVar1 - Line) {
LAB_0010758f:
        __assert_fail("bits_per_sample > 0 && bits_per_sample <= 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/util.h"
                      ,0x1a7,"int32_t charls::calculate_maximum_sample_value(const int32_t)");
      }
      uVar10 = ~(-1 << ((byte)iVar1 & 0x1f));
      uVar2 = preset_coding_parameters->maximum_sample_value;
      local_48 = (ulong)uVar2;
      uVar3 = in_R8[4];
      iVar9 = (int)(uVar10 + uVar2 * 2) / (int)(uVar2 * 2 + 1) + 1;
      iVar6 = log2_ceil(iVar9);
      iVar7 = log2_ceil(uVar10);
      uVar4 = *in_R8;
      this_00 = (jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>
                 *)operator_new(0x17d0);
      iVar8 = 8;
      if (8 < iVar7) {
        iVar8 = iVar7;
      }
      local_54 = (iVar8 + iVar7) * 2;
      local_68 = CONCAT44((int)local_48,uVar4);
      traits.reset_threshold = uVar3;
      traits.limit = local_54;
      traits.range = iVar9;
      traits.maximum_sample_value = uVar4;
      traits.near_lossless = (int)local_48;
      traits.quantized_bits_per_pixel = iVar6;
      traits.bits_per_pixel = iVar7;
      iStack_60 = iVar9;
      iStack_5c = iVar6;
      local_58 = iVar7;
      local_50 = uVar3;
      jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>::
      jls_codec(this_00,traits,(frame_info *)local_38,(coding_parameters *)local_40);
      *(jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy> **
       )this = this_00;
    }
    else {
      if (0x10 < iVar1) goto LAB_0010758f;
      uVar10 = ~(-1 << ((byte)iVar1 & 0x1f));
      uVar2 = preset_coding_parameters->maximum_sample_value;
      local_48 = (ulong)uVar2;
      uVar3 = in_R8[4];
      iVar9 = (int)(uVar10 + uVar2 * 2) / (int)(uVar2 * 2 + 1) + 1;
      iVar6 = log2_ceil(iVar9);
      iVar7 = log2_ceil(uVar10);
      uVar4 = *in_R8;
      this_01 = (jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
                 *)operator_new(0x17d0);
      iVar8 = 8;
      if (8 < iVar7) {
        iVar8 = iVar7;
      }
      local_54 = (iVar8 + iVar7) * 2;
      local_68 = CONCAT44((int)local_48,uVar4);
      traits_00.reset_threshold = uVar3;
      traits_00.limit = local_54;
      traits_00.range = iVar9;
      traits_00.maximum_sample_value = uVar4;
      traits_00.near_lossless = (int)local_48;
      traits_00.quantized_bits_per_pixel = iVar6;
      traits_00.bits_per_pixel = iVar7;
      iStack_60 = iVar9;
      iStack_5c = iVar6;
      local_58 = iVar7;
      local_50 = uVar3;
      jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>::
      jls_codec(this_01,traits_00,(frame_info *)local_38,(coding_parameters *)local_40);
      *(jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
        **)this = this_01;
    }
  }
  (**(code **)(**(long **)this + 0x18))();
  return (__uniq_ptr_data<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>,_true,_true>
          )(__uniq_ptr_data<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>,_true,_true>
            )this;
}

Assistant:

unique_ptr<Strategy> jls_codec_factory<Strategy>::create_codec(const frame_info& frame, const coding_parameters& parameters,
                                                               const jpegls_pc_parameters& preset_coding_parameters)
{
    unique_ptr<Strategy> codec;

    if (preset_coding_parameters.reset_value == default_reset_value)
    {
        codec = try_create_optimized_codec(frame, parameters);
    }

    if (!codec)
    {
        if (frame.bits_per_sample <= 8)
        {
            default_traits<uint8_t, uint8_t> traits(calculate_maximum_sample_value(frame.bits_per_sample),
                                                    parameters.near_lossless, preset_coding_parameters.reset_value);
            traits.maximum_sample_value = preset_coding_parameters.maximum_sample_value;
            codec = make_unique<jls_codec<default_traits<uint8_t, uint8_t>, Strategy>>(traits, frame, parameters);
        }
        else
        {
            default_traits<uint16_t, uint16_t> traits(calculate_maximum_sample_value(frame.bits_per_sample),
                                                      parameters.near_lossless, preset_coding_parameters.reset_value);
            traits.maximum_sample_value = preset_coding_parameters.maximum_sample_value;
            codec = make_unique<jls_codec<default_traits<uint16_t, uint16_t>, Strategy>>(traits, frame, parameters);
        }
    }

    codec->set_presets(preset_coding_parameters, parameters.restart_interval);
    return codec;
}